

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_1::PosixSequentialFile::~PosixSequentialFile(PosixSequentialFile *this)

{
  close(this->fd_);
  std::__cxx11::string::_M_dispose();
  SequentialFile::~SequentialFile(&this->super_SequentialFile);
  return;
}

Assistant:

~PosixSequentialFile() override { close(fd_); }